

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdtls.cpp
# Opt level: O0

bool __thiscall QDtls::resumeHandshake(QDtls *this,QUdpSocket *socket)

{
  long lVar1;
  byte bVar2;
  int iVar3;
  pointer s;
  pointer pDVar4;
  long in_RSI;
  long in_FS_OFFSET;
  DtlsCryptograph *backend;
  QDtlsPrivate *d;
  int in_stack_ffffffffffffff6c;
  char *in_stack_ffffffffffffff70;
  char *c;
  char *in_stack_ffffffffffffff78;
  bool local_39;
  undefined1 local_38 [24];
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QDtls *)0x3bab60);
  s = std::
      unique_ptr<QTlsPrivate::DtlsCryptograph,_std::default_delete<QTlsPrivate::DtlsCryptograph>_>::
      get((unique_ptr<QTlsPrivate::DtlsCryptograph,_std::default_delete<QTlsPrivate::DtlsCryptograph>_>
           *)0x3bab73);
  if (s == (pointer)0x0) {
    local_39 = false;
  }
  else if (in_RSI == 0) {
    lVar1 = *(long *)(*(long *)s + -0x60);
    tr(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    (**(code **)(*(long *)(s + lVar1) + 0x10))(s + lVar1,1,local_20);
    QString::~QString((QString *)0x3babf4);
    local_39 = false;
  }
  else {
    iVar3 = (**(code **)(*(long *)s + 0x90))();
    if (iVar3 == 2) {
      bVar2 = (**(code **)(*(long *)s + 0xb8))(s,in_RSI);
      local_39 = (bool)(bVar2 & 1);
    }
    else {
      c = *(char **)(*(long *)s + -0x60);
      pDVar4 = s + (long)c;
      tr((char *)s,c,in_stack_ffffffffffffff6c);
      (**(code **)(*(long *)(s + (long)c) + 0x10))(pDVar4,2,local_38);
      QString::~QString((QString *)0x3bac73);
      local_39 = false;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_39;
  }
  __stack_chk_fail();
}

Assistant:

bool QDtls::resumeHandshake(QUdpSocket *socket)
{
    Q_D(QDtls);

    auto *backend = d->backend.get();
    if (!backend)
        return false;

    if (!socket) {
        backend->setDtlsError(QDtlsError::InvalidInputParameters, tr("Invalid (nullptr) socket"));
        return false;
    }

    if (backend->state() != PeerVerificationFailed) {
        backend->setDtlsError(QDtlsError::InvalidOperation,
                              tr("Cannot resume, not in VerificationError state"));
        return false;
    }

    return backend->resumeHandshake(socket);
}